

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,ft::allocator<int>>::unique<ft::equal_to<int>>(list<int,ft::allocator<int>> *this)

{
  bool bVar1;
  size_type sVar2;
  reference x;
  reference y;
  listIterator<int> local_78;
  undefined1 local_68 [24];
  iterator prev;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  iterator it;
  list<int,_ft::allocator<int>_> *this_local;
  
  it.m_node = (Node *)this;
  sVar2 = list<int,_ft::allocator<int>_>::size((list<int,_ft::allocator<int>_> *)this);
  if (1 < sVar2) {
    list<int,_ft::allocator<int>_>::begin((list<int,_ft::allocator<int>_> *)local_28);
    listIterator<int>::operator++((listIterator<int> *)local_28);
    while( true ) {
      list<int,_ft::allocator<int>_>::end((list<int,_ft::allocator<int>_> *)local_38);
      bVar1 = operator!=((listIterator<int> *)local_28,(listIterator<int> *)local_38);
      listIterator<int>::~listIterator((listIterator<int> *)local_38);
      if (!bVar1) break;
      listIterator<int>::listIterator
                ((listIterator<int> *)(local_68 + 0x10),(listIterator<int> *)local_28);
      listIterator<int>::operator--((listIterator<int> *)(local_68 + 0x10));
      x = listIterator<int>::operator*((listIterator<int> *)local_28);
      y = listIterator<int>::operator*((listIterator<int> *)(local_68 + 0x10));
      bVar1 = equal_to<int>::operator()((equal_to<int> *)((long)&this_local + 7),x,y);
      if (bVar1) {
        listIterator<int>::listIterator(&local_78,(listIterator<int> *)local_28);
        list<int,_ft::allocator<int>_>::erase
                  ((list<int,_ft::allocator<int>_> *)local_68,(iterator *)this);
        listIterator<int>::operator=((listIterator<int> *)local_28,(listIterator<int> *)local_68);
        listIterator<int>::~listIterator((listIterator<int> *)local_68);
        listIterator<int>::~listIterator(&local_78);
      }
      else {
        listIterator<int>::operator++((listIterator<int> *)local_28);
      }
      listIterator<int>::~listIterator((listIterator<int> *)(local_68 + 0x10));
    }
    listIterator<int>::~listIterator((listIterator<int> *)local_28);
  }
  return;
}

Assistant:

void unique(BinaryPredicate binary_pred) {
		if (this->size() <= 1)
			return ;
		iterator	it = this->begin();
		++it;
		while (it != this->end()) {
			iterator	prev = it;
			--prev;
			if (binary_pred(*it, *prev))
				it = this->erase(it);
			else
				++it;
		}
	}